

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

bool ActionMarkImplied::isPossibleAlias(Varnode *vn1,Varnode *vn2,int4 depth)

{
  OpCode OVar1;
  PcodeOp *pPVar2;
  PcodeOp *pPVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  OpCode OVar9;
  OpCode OVar10;
  
  while( true ) {
    if (vn1 == vn2) {
      return true;
    }
    if (((vn1->flags & 0x10) == 0) || ((vn2->flags & 0x10) == 0)) {
      if (((vn1->flags & 2) != 0) && ((vn2->flags & 2) != 0)) {
        return (vn1->loc).offset == (vn2->loc).offset;
      }
      bVar6 = isPossibleAliasStep(vn1,vn2);
      return bVar6;
    }
    bVar6 = isPossibleAliasStep(vn1,vn2);
    if (!bVar6) {
      return false;
    }
    pPVar2 = vn1->def;
    OVar1 = pPVar2->opcode->opcode;
    iVar7 = 1;
    iVar8 = 1;
    OVar10 = CPUI_INT_ADD;
    if ((OVar1 != CPUI_PTRSUB) && (OVar10 = OVar1, OVar1 == CPUI_PTRADD)) {
      iVar8 = (int)((pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[2]->loc).offset;
      OVar10 = CPUI_INT_ADD;
    }
    pPVar3 = vn2->def;
    OVar1 = pPVar3->opcode->opcode;
    OVar9 = CPUI_INT_ADD;
    if ((OVar1 != CPUI_PTRSUB) && (OVar9 = OVar1, OVar1 == CPUI_PTRADD)) {
      iVar7 = (int)((pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[2]->loc).offset;
      OVar9 = CPUI_INT_ADD;
    }
    bVar6 = depth == 0;
    depth = depth + -1;
    if (bVar6) break;
    if (OVar10 != OVar9) {
      return true;
    }
    if (CPUI_INT_NEGATE < OVar10) {
      return true;
    }
    if ((0x3060002U >> (OVar10 & CPUI_INT_SRIGHT) & 1) == 0) {
      if (OVar10 != CPUI_INT_ADD) {
        return true;
      }
      ppVVar4 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar5 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((ppVVar4[1]->flags & 2) == 0) || ((ppVVar5[1]->flags & 2) == 0)) {
        if (iVar8 != iVar7) {
          return true;
        }
        bVar6 = functionalEquality(*ppVVar4,*ppVVar5);
        vn1 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start[1];
        vn2 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start[1];
        if (!bVar6) {
          bVar6 = functionalEquality(vn1,vn2);
          vn1 = *(pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          ppVVar4 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (bVar6) {
            vn2 = *ppVVar4;
          }
          else {
            bVar6 = functionalEquality(vn1,ppVVar4[1]);
            vn1 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start[1];
            vn2 = *(pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            if (!bVar6) {
              bVar6 = functionalEquality(vn1,vn2);
              if (!bVar6) {
                return true;
              }
              vn1 = *(pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              vn2 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[1];
            }
          }
        }
      }
      else {
        vn1 = *ppVVar4;
        vn2 = *ppVVar5;
        if ((long)iVar8 * (ppVVar4[1]->loc).offset - (long)iVar7 * (ppVVar5[1]->loc).offset != 0) {
          bVar6 = functionalEquality(vn1,vn2);
          return !bVar6;
        }
      }
    }
    else {
      vn1 = *(pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      vn2 = *(pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
    }
  }
  return true;
}

Assistant:

bool ActionMarkImplied::isPossibleAlias(Varnode *vn1,Varnode *vn2,int4 depth)

{
  if (vn1 == vn2) return true;	// Definite alias
  if ((!vn1->isWritten())||(!vn2->isWritten())) {
    if (vn1->isConstant() && vn2->isConstant())
      return (vn1->getOffset()==vn2->getOffset()); // FIXME: these could be NEAR each other and still have an alias
    return isPossibleAliasStep(vn1,vn2);
  }

  if (!isPossibleAliasStep(vn1,vn2))
    return false;
  Varnode *cvn1,*cvn2;
  PcodeOp *op1 = vn1->getDef();
  PcodeOp *op2 = vn2->getDef();
  OpCode opc1 = op1->code();
  OpCode opc2 = op2->code();
  int4 mult1 = 1;
  int4 mult2 = 1;
  if (opc1 == CPUI_PTRSUB)
    opc1 = CPUI_INT_ADD;
  else if (opc1 == CPUI_PTRADD) {
    opc1 = CPUI_INT_ADD;
    mult1 = (int4) op1->getIn(2)->getOffset();
  }
  if (opc2 == CPUI_PTRSUB)
    opc2 = CPUI_INT_ADD;
  else if (opc2 == CPUI_PTRADD) {
    opc2 = CPUI_INT_ADD;
    mult2 = (int4) op2->getIn(2)->getOffset();
  }
  if (opc1 != opc2) return true;
  if (depth == 0) return true;	// Couldn't find absolute difference
  depth -= 1;
  switch(opc1) {
  case CPUI_COPY:
  case CPUI_INT_ZEXT:
  case CPUI_INT_SEXT:
  case CPUI_INT_2COMP:
  case CPUI_INT_NEGATE:
    return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
  case CPUI_INT_ADD:
    cvn1 = op1->getIn(1);
    cvn2 = op2->getIn(1);
    if (cvn1->isConstant() && cvn2->isConstant()) {
      uintb val1 = mult1 * cvn1->getOffset();
      uintb val2 = mult2 * cvn2->getOffset();
      if (val1 == val2)
	return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
      return !functionalEquality(op1->getIn(0),op2->getIn(0));
    }
    if (mult1 != mult2) return true;
    if (functionalEquality(op1->getIn(0),op2->getIn(0)))
      return isPossibleAlias(op1->getIn(1),op2->getIn(1),depth);
    if (functionalEquality(op1->getIn(1),op2->getIn(1)))
      return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
    if (functionalEquality(op1->getIn(0),op2->getIn(1)))
      return isPossibleAlias(op1->getIn(1),op2->getIn(0),depth);
    if (functionalEquality(op1->getIn(1),op2->getIn(0)))
      return isPossibleAlias(op1->getIn(0),op2->getIn(1),depth);
    break;
  default:
    break;
  }
  return true;
}